

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

int enhance_weapon_skill(void)

{
  nh_menuitem *pnVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  unsigned_short uVar5;
  ushort uVar6;
  char cVar7;
  boolean bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  objdescr *poVar14;
  byte bVar15;
  char *pcVar16;
  char *pcVar17;
  int tmp;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  char **ppcVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  bool speedy;
  bool bVar28;
  bool bVar29;
  menulist menu;
  int local_270;
  int selected [1];
  char buf [256];
  char local_138 [264];
  
  if (flags.debug == '\0') {
    speedy = false;
  }
  else {
    cVar7 = yn_function("Advance skills without practice?","yn",'n');
    speedy = cVar7 == 'y';
  }
  init_menulist(&menu);
  do {
    menu.icount = 0;
    lVar26 = 0;
    local_270 = 0;
    iVar10 = 0;
    do {
      if (u.weapon_skills[lVar26].skill != '\0') {
        bVar8 = can_advance((int)lVar26,speedy);
        if (bVar8 == '\0') {
          bVar15 = could_advance((int)lVar26);
          iVar10 = iVar10 + (uint)bVar15;
        }
        else {
          local_270 = local_270 + 1;
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0x2a);
    if (0 < iVar10) {
      pcVar20 = "s";
      if (iVar10 == 1) {
        pcVar20 = "";
      }
      pcVar16 = "if skill slots become available";
      if (u.ulevel < 0x1e) {
        pcVar16 = "when you\'re more experienced";
      }
      sprintf(buf,"(Skill%s flagged by \"*\" may be enhanced %s.)",pcVar20,pcVar16);
      lVar26 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar26 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,buf);
      menu.icount = menu.icount + 1;
      lVar26 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar26 * 0x218);
      }
      lVar26 = (long)menu.icount;
      menu.items[lVar26].accel = '\0';
      menu.items[lVar26].group_accel = '\0';
      menu.items[lVar26].selected = '\0';
      menu.items[lVar26].caption[0] = '\0';
      menu.items[lVar26].id = 0;
      menu.items[lVar26].role = MI_TEXT;
      menu.icount = menu.icount + 1;
    }
    pcVar20 = "\n\n";
    if (iVar10 + local_270 != 0 && SCARRY4(iVar10,local_270) == iVar10 + local_270 < 0) {
      pcVar20 = "      ";
    }
    lVar26 = 0;
    do {
      sVar3 = skill_ranges[lVar26].first;
      sVar4 = skill_ranges[lVar26].last;
      if (sVar3 <= sVar4) {
        uVar27 = (long)sVar3;
        do {
          if (uVar27 == (long)sVar3) {
            lVar11 = (long)menu.size;
            if (menu.size <= menu.icount) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
            }
            pnVar1 = menu.items + menu.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_HEADING;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,skill_ranges[lVar26].name);
            menu.icount = menu.icount + 1;
          }
          if (u.weapon_skills[uVar27].skill != '\0') {
            iVar10 = (int)uVar27;
            bVar8 = can_advance(iVar10,speedy);
            pcVar16 = "";
            if (bVar8 == '\0') {
              bVar8 = could_advance(iVar10);
              pcVar16 = "  * ";
              if (bVar8 == '\0') {
                pcVar16 = pcVar20 + 2;
              }
            }
            buf[0] = ' ';
            buf[1] = '\0';
            pcVar12 = eos(buf);
            if ((0x2ffd7bfeUL >> (uVar27 & 0x3f) & 1) == 0) {
              if (uVar27 == 0x25) {
                uVar13 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
                ppcVar21 = barehands_or_martial;
              }
              else {
                uVar13 = (ulong)(uint)-(int)skill_names_indices[uVar27];
                ppcVar21 = odd_skill_names;
              }
              poVar14 = (objdescr *)(ppcVar21 + uVar13);
            }
            else {
              poVar14 = obj_descr + objects[skill_names_indices[uVar27]].oc_name_idx;
            }
            sprintf(pcVar12,"%s%s",pcVar16,poVar14->oc_name);
            uVar9 = skill_crosstrain_bonus(iVar10);
            if ((1 < (int)uVar9) &&
               (u.weapon_skills[uVar27].skill < u.weapon_skills[uVar27].max_skill)) {
              pcVar16 = eos(buf);
              sprintf(pcVar16," (x%d)",(ulong)uVar9);
            }
            pcVar12 = eos(buf);
            bVar15 = u.weapon_skills[uVar27].skill - 1;
            pcVar16 = "Unknown";
            if (bVar15 < 6) {
              pcVar16 = (&PTR_anon_var_dwarf_150cc5_00313308)[bVar15];
            }
            bVar15 = u.weapon_skills[uVar27].max_skill - 1;
            pcVar17 = "Unknown";
            if (bVar15 < 6) {
              pcVar17 = (&PTR_anon_var_dwarf_150cc5_00313308)[bVar15];
            }
            sprintf(pcVar12,"\t[%s\t/ %s]",pcVar16,pcVar17);
            if (u.weapon_skills[uVar27].skill == u.weapon_skills[uVar27].max_skill) {
              pcVar16 = eos(buf);
              pcVar17 = (char *)0x58414d20202009;
              builtin_strncpy(pcVar16,"\t   MAX",8);
            }
            else {
              uVar5 = u.weapon_skills[uVar27].advance;
              pcVar16 = eos(buf);
              if (uVar5 == 0) {
                builtin_strncpy(pcVar16,"\t      ",8);
              }
              else {
                cVar7 = u.weapon_skills[uVar27].skill;
                uVar9 = (uint)cVar7;
                pcVar17 = (char *)(ulong)uVar9;
                uVar13 = 0;
                if ((uVar9 != 0) && (cVar2 = u.weapon_skills[uVar27].max_skill, cVar7 < cVar2)) {
                  uVar6 = u.weapon_skills[uVar27].advance;
                  uVar13 = (ulong)(((int)cVar2 - uVar9) * 100);
                  uVar23 = uVar9 - 2;
                  iVar24 = uVar9 * 0x14;
                  iVar22 = 0;
                  do {
                    iVar25 = 100 << ((byte)(uVar23 + 1) & 0x1f);
                    if (iVar10 - 0x1eU < 7) {
                      iVar25 = (uVar23 + 2) * iVar24;
                    }
                    if ((int)(uint)uVar6 < iVar25) {
                      if (uVar23 == 0xffffffff) {
                        iVar18 = 0;
                        uVar23 = uVar23 + 1;
                      }
                      else {
                        iVar18 = 100 << ((byte)uVar23 & 0x1f);
                        if (iVar10 - 0x1eU < 7) {
                          iVar18 = (iVar24 + -0x14) * (uVar23 + 1);
                        }
                      }
                      pcVar17 = (char *)(ulong)uVar23;
                      iVar24 = (int)(((uint)uVar6 - iVar18) * 100) / (iVar25 - iVar18);
                      if (99 < iVar24) {
                        iVar24 = 100;
                      }
                      uVar13 = (ulong)(uint)(iVar24 - iVar22);
                      break;
                    }
                    iVar22 = iVar22 + -100;
                    uVar9 = (uVar23 - (int)cVar2) + 1;
                    pcVar17 = (char *)(ulong)uVar9;
                    uVar23 = uVar23 + 1;
                    iVar24 = iVar24 + 0x14;
                  } while (uVar9 != 0xfffffffe);
                }
                sprintf(pcVar16,"\t%5d%%",uVar13);
              }
            }
            if (flags.debug != '\0') {
              pcVar16 = eos(buf);
              cVar7 = u.weapon_skills[uVar27].skill;
              uVar9 = (int)cVar7 * (int)cVar7 * 0x14;
              if (6 < iVar10 - 0x1eU) {
                uVar9 = 100 << (cVar7 - 1U & 0x1f);
              }
              pcVar17 = (char *)(ulong)uVar9;
              sprintf(pcVar16,"/%5d(%4d)",(ulong)u.weapon_skills[uVar27].advance,pcVar17);
            }
            bVar8 = could_advance(iVar10);
            if (((bVar8 != '\0') || (bVar8 = can_advance(iVar10,speedy), bVar8 != '\0')) &&
               ((speedy & flags.debug != '\0') == 0)) {
              pcVar16 = eos(buf);
              uVar9 = (uint)u.weapon_skills[uVar27].skill;
              uVar13 = CONCAT71((int7)((ulong)pcVar17 >> 8),(long)uVar27 < 0x1e);
              if (uVar27 != 0x26 && (long)uVar27 >= 0x1e) {
                uVar9 = (uVar9 - ((int)(uVar9 + 1) >> 0x1f)) + 1 >> 1;
                uVar13 = (ulong)uVar9;
                uVar9 = (uint)(char)uVar9;
              }
              sprintf(pcVar16," (%d to advance)",(ulong)uVar9,uVar13);
            }
            bVar8 = can_advance(iVar10,speedy);
            iVar10 = iVar10 + 1;
            if (bVar8 == '\0') {
              iVar10 = 0;
            }
            lVar11 = (long)menu.size;
            if (menu.size <= menu.icount) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar11 * 0x218);
            }
            pnVar1 = menu.items + menu.icount;
            pnVar1->id = iVar10;
            pnVar1->role = MI_NORMAL;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,buf);
            menu.icount = menu.icount + 1;
          }
          bVar28 = uVar27 != (long)sVar4;
          uVar27 = uVar27 + 1;
        } while (bVar28);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 3);
    pcVar20 = "Current skills:";
    if (0 < local_270) {
      pcVar20 = "Pick a skill to advance:";
    }
    strcpy(buf,pcVar20);
    if ((speedy & flags.debug != '\0') == 0) {
      pcVar20 = eos(buf);
      pcVar16 = "s";
      if (u.weapon_slots == 1) {
        pcVar16 = "";
      }
      sprintf(pcVar20,"  (%d slot%s available)",(ulong)(uint)u.weapon_slots,pcVar16);
    }
    iVar10 = display_menu(menu.items,menu.icount,buf,(uint)(local_270 != 0),selected);
    if (iVar10 == 1) {
      lVar26 = (long)selected[0];
      uVar27 = lVar26 - 1;
      sVar3 = *(short *)(&DAT_002d88ce + lVar26 * 2);
      uVar9 = (uint)uVar27;
      if ((0x2ffd7bfeUL >> (uVar27 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x25) {
          uVar13 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
          ppcVar21 = barehands_or_martial;
        }
        else {
          uVar13 = (ulong)(uint)-(int)sVar3;
          ppcVar21 = odd_skill_names;
        }
        poVar14 = (objdescr *)(ppcVar21 + uVar13);
      }
      else {
        poVar14 = obj_descr + objects[sVar3].oc_name_idx;
      }
      bVar15 = u.weapon_skills[lVar26 + -1].skill;
      pcVar20 = "Unknown";
      if ((ulong)bVar15 < 6) {
        pcVar20 = (&PTR_anon_var_dwarf_150cc5_00313308)[bVar15];
      }
      uVar19 = (uint)(char)bVar15;
      bVar28 = 0x1e < selected[0];
      bVar29 = uVar9 != 0x26;
      uVar23 = uVar19;
      if (bVar29 && bVar28) {
        uVar23 = (uint)(char)((uVar19 - ((int)(uVar19 + 1) >> 0x1f)) + 1 >> 1);
      }
      if (bVar29 && bVar28) {
        uVar19 = (uint)(char)((uVar19 - ((int)(uVar19 + 1) >> 0x1f)) + 1 >> 1);
      }
      pcVar12 = "s";
      pcVar16 = "s";
      if (uVar19 == 1) {
        pcVar16 = "";
      }
      if (u.weapon_slots == 1) {
        pcVar12 = "";
      }
      snprintf(local_138,0x100,"Enhance %s to %s for %d slot%s (%d slot%s left)?",poVar14->oc_name,
               pcVar20,(ulong)uVar23,pcVar16,(ulong)(uint)u.weapon_slots,pcVar12);
      cVar7 = yn_function(local_138,"yn",'n');
      if (cVar7 == 'y') {
        cVar2 = u.weapon_skills[lVar26 + -1].skill;
        iVar10 = (int)cVar2;
        if (bVar29 && bVar28) {
          iVar10 = (int)(char)((iVar10 - (iVar10 + 1 >> 0x1f)) + 1U >> 1);
        }
        u.weapon_slots = u.weapon_slots - iVar10;
        u.weapon_skills[lVar26 + -1].skill = cVar2 + '\x01';
        lVar11 = (long)u.skills_advanced;
        u.skills_advanced = u.skills_advanced + 1;
        u.skill_record[lVar11] = (byte)uVar27;
        pcVar20 = "most";
        if (u.weapon_skills[lVar26 + -1].skill < u.weapon_skills[lVar26 + -1].max_skill) {
          pcVar20 = "more";
        }
        if ((0x2ffd7bfeUL >> ((byte)uVar27 & 0x3f) & 1) == 0) {
          if (uVar9 == 0x25) {
            poVar14 = (objdescr *)
                      (barehands_or_martial + (urole.malenum == 0x160 || urole.malenum == 0x165));
          }
          else {
            poVar14 = (objdescr *)(odd_skill_names + (uint)-(int)sVar3);
          }
        }
        else {
          poVar14 = obj_descr + objects[sVar3].oc_name_idx;
        }
        pline("You are now %s skilled in %s.",pcVar20,poVar14->oc_name);
        if ((uVar9 & 0xfffffffe) == 0x28) {
          find_ac();
        }
        if (uVar9 == 0x28) {
          encumber_msg();
        }
      }
      iVar10 = 0;
      do {
        bVar8 = can_advance(iVar10,speedy);
        if (bVar8 != '\0') {
          iVar10 = 1;
          if (cVar7 == 'y' && speedy == false) {
            pline("You feel you could be more dangerous!");
          }
          goto LAB_00284db4;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x2a);
      iVar10 = 0;
    }
LAB_00284db4:
    if ((speedy & 0 < iVar10) == 0) {
      free(menu.items);
      return 0;
    }
  } while( true );
}

Assistant:

int enhance_weapon_skill(void)
{
    int pass, i, n, crosstrain, id,
	to_advance, eventually_advance, selected[1];
    char buf[BUFSZ];
    const char *prefix;
    struct menulist menu;
    boolean speedy = FALSE;

    if (wizard && yn("Advance skills without practice?") == 'y')
	speedy = TRUE;

    init_menulist(&menu);
    do {
	menu.icount = 0;
	/* count skills that can advance */
	to_advance = eventually_advance = 0;
	for (i = 0; i < P_NUM_SKILLS; i++) {
	    if (P_RESTRICTED(i))
		continue;
	    if (can_advance(i, speedy)) to_advance++;
	    else if (could_advance(i)) eventually_advance++;
	}

	/* start with a legend if any entries will be annotated
	    with "*" below */
	if (eventually_advance > 0) {
	    sprintf(buf,
		    "(Skill%s flagged by \"*\" may be enhanced %s.)",
		    plur(eventually_advance),
		    (u.ulevel < MAXULEV) ?
			"when you're more experienced" :
			"if skill slots become available");
	    add_menutext(&menu, buf);
	    add_menutext(&menu, "");
	}

	/* List the skills, making ones that could be advanced
	    selectable.  List the miscellaneous skills first.
	    Possible future enhancement:  list spell skills before
	    weapon skills for spellcaster roles. */
	for (pass = 0; pass < SIZE(skill_ranges); pass++)
	    for (i = skill_ranges[pass].first;
		i <= skill_ranges[pass].last; i++) {
	    /* Print headings for skill types */
	    if (i == skill_ranges[pass].first)
		add_menuheading(&menu, skill_ranges[pass].name);

	    if (P_RESTRICTED(i))
		continue;
	    /*
	     * The 12 is the longest skill level name.
	     * The "    " is room for a selection letter and dash, "a - ".
	     */
	    if (can_advance(i, speedy))
		prefix = "";	/* will be preceded by menu choice */
	    else if (could_advance(i))
		prefix = "  * ";
	    else
		prefix = (to_advance + eventually_advance > 0) ? "    " : "";
	    strcpy(buf, " ");
	    sprintf(eos(buf), "%s%s", prefix, P_NAME(i));
	    crosstrain = skill_crosstrain_bonus(i);
	    if (crosstrain > 1 && P_SKILL(i) < P_MAX_SKILL(i))
		sprintf(eos(buf), " (x%d)", crosstrain);

	    sprintf(eos(buf), "\t[%s\t/ %s]",
		    skill_level_name(P_SKILL(i)),
		    skill_level_name(P_MAX_SKILL(i)));

	    if (P_SKILL(i) == P_MAX_SKILL(i)) {
		sprintf(eos(buf), "\t   MAX");
	    } else if (P_ADVANCE(i) == 0) {
		sprintf(eos(buf), "\t      ");
	    } else {
		sprintf(eos(buf), "\t%5d%%", skill_training_percent(i));
	    }
	    if (wizard) {
		sprintf(eos(buf), "/%5d(%4d)",
			P_ADVANCE(i), practice_needed_to_advance(i, P_SKILL(i)));
	    }

	    if ((could_advance(i) || can_advance(i, speedy)) && !(wizard && speedy))
		sprintf(eos(buf), " (%d to advance)", slots_required(i));
	    id = can_advance(i, speedy) ? i+1 : 0;
	    add_menuitem(&menu, id, buf, 0, FALSE);
	}

	strcpy(buf, (to_advance > 0) ? "Pick a skill to advance:" :
					"Current skills:");
	if (!(wizard && speedy)) {
	    sprintf(eos(buf), "  (%d slot%s available)",
		    u.weapon_slots, plur(u.weapon_slots));
	}
	n = display_menu(menu.items, menu.icount, buf,
			    to_advance ? PICK_ONE : PICK_NONE, selected);
	if (n == 1) {
	    boolean skill_advanced;
	    n = selected[0] - 1;	/* get item selected */
	    skill_advanced = skill_advance(n);
	    /* check for more skills able to advance, if so then .. */
	    for (n = i = 0; i < P_NUM_SKILLS; i++) {
		if (can_advance(i, speedy)) {
		    if (skill_advanced && !speedy)
			pline("You feel you could be more dangerous!");
		    n++;
		    break;
		}
	    }
	}
    } while (speedy && n > 0);
    
    free(menu.items);
    return 0;
}